

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_resize.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  GLFWwindow *handle;
  int iVar1;
  
  glfwInit();
  glfwWindowHint(0x20004,1);
  iVar1 = 0;
  handle = glfwCreateWindow(0x140,0xf0,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar1 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    checkWindowSize(handle,0x140,0xf0,true);
    glClearColor(0x3f800000,0,0,0x3f800000);
    glClearDepth(0x3ff0000000000000);
    glClear(0x4100);
    glfwSwapBuffers(handle);
    usleep(500000);
    glfwSetWindowSize(handle,0x280,0x1e0);
    glfwMakeContextCurrent(handle);
    glViewport(0,0,0x280,0x1e0);
    glScissor(0,0,0x280);
    checkWindowSize(handle,0x280,0x1e0,false);
    glClearColor(0x3f800000,0x3f800000,0,0x3f800000);
    glClearDepth(0x3ff0000000000000);
    glClear(0x4100);
    glfwSwapBuffers(handle);
    usleep(500000);
    checkWindowSize(handle,0x280,0x1e0,true);
    glClearColor(0,0x3f800000,0,0x3f800000);
    glClearDepth(0x3ff0000000000000);
    glClear(0x4100);
    glfwSwapBuffers(handle);
    usleep(500000);
    glfwDestroyWindow(handle);
    glfwTerminate();
  }
  return iVar1;
}

Assistant:

int
main(int argc, char** argv)
{
    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_TRUE);

    GLFWwindow* window = glfwCreateWindow(320, 240, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    checkWindowSize(window, 320, 240, true);

    glClearColor(1.0f, 0.0f, 0.0f, 1.0f);  // red
    glClearDepth(1.0f);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    glfwSwapBuffers(window);
    sleep();

    glfwSetWindowSize(window, 640, 480);

    glfwMakeContextCurrent(window);

    glViewport(0, 0, 640, 480);
    glScissor(0, 0, 640, 480);

    // XXX: This does not always succeed immediately
    checkWindowSize(window, 640, 480, false);

    glClearColor(1.0f, 1.0f, 0.0f, 1.0f);  // yellow
    glClearDepth(1.0f);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
    glfwSwapBuffers(window);
    sleep();

    checkWindowSize(window, 640, 480, true);

    glClearColor(0.0f, 1.0f, 0.0f, 1.0f);  // green
    glClearDepth(1.0f);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    glfwSwapBuffers(window);
    sleep();

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}